

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_reader.cc
# Opt level: O0

bool __thiscall xsettingsd::DataReader::ReadBytes(DataReader *this,string *out,size_t size)

{
  size_t size_local;
  string *out_local;
  DataReader *this_local;
  
  if ((this->buf_len_ < this->bytes_read_ + size) || (this->bytes_read_ + size < this->bytes_read_))
  {
    this_local._7_1_ = false;
  }
  else {
    if (out != (string *)0x0) {
      std::__cxx11::string::assign((char *)out,(ulong)(this->buffer_ + this->bytes_read_));
    }
    this->bytes_read_ = size + this->bytes_read_;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DataReader::ReadBytes(string* out, size_t size) {
  if (bytes_read_ + size > buf_len_ ||
      bytes_read_ + size < bytes_read_) {
    return false;
  }
  if (out)
    out->assign(buffer_ + bytes_read_, size);
  bytes_read_ += size;
  return true;
}